

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_umax8_ppc(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  byte local_40;
  uint8_t dd;
  uint8_t bb;
  long lStack_38;
  uint8_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_38 = 0; lStack_38 < oprsz_00; lStack_38 = lStack_38 + 1) {
    local_40 = *(byte *)((long)b + lStack_38);
    if (local_40 < *(byte *)((long)a + lStack_38)) {
      local_40 = *(byte *)((long)a + lStack_38);
    }
    *(byte *)((long)d + lStack_38) = local_40;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_umax8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        uint8_t aa = *(uint8_t *)((char *)a + i);
        uint8_t bb = *(uint8_t *)((char *)b + i);
        uint8_t dd = aa > bb ? aa : bb;
        *(uint8_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}